

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

String * __thiscall
kj::InputStream::readAllText(String *__return_storage_ptr__,InputStream *this,uint64_t limit)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  uchar *puVar4;
  size_t sVar5;
  Array<unsigned_char> local_28;
  
  anon_unknown_75::readAll(&local_28,this,limit,true);
  sVar5 = local_28.size_;
  puVar4 = local_28.ptr;
  if (local_28.disposer == (ArrayDisposer *)0x0) {
    puVar4 = (uchar *)0x0;
    sVar5 = 0;
    pAVar3 = (ArrayDisposer *)0x0;
  }
  else {
    local_28.ptr = (uchar *)0x0;
    local_28.size_ = 0;
    pAVar3 = local_28.disposer;
  }
  sVar2 = local_28.size_;
  puVar1 = local_28.ptr;
  (__return_storage_ptr__->content).ptr = (char *)puVar4;
  (__return_storage_ptr__->content).size_ = sVar5;
  (__return_storage_ptr__->content).disposer = pAVar3;
  if (local_28.ptr != (uchar *)0x0) {
    local_28.ptr = (uchar *)0x0;
    local_28.size_ = 0;
    (*(code *)**(undefined8 **)local_28.disposer)(local_28.disposer,puVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String InputStream::readAllText(uint64_t limit) {
  return String(readAll(*this, limit, true).releaseAsChars());
}